

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O2

void __thiscall
libtorrent::anon_unknown_5::ut_metadata_peer_plugin::write_metadata_packet
          (ut_metadata_peer_plugin *this,msg_t type,int piece)

{
  char *pcVar1;
  int iVar2;
  entry *peVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  char *pcVar5;
  int size;
  ulong i;
  string_view key;
  string_view key_00;
  string_view key_01;
  span<char> holder;
  span<const_char> sVar6;
  char *header;
  entry e;
  char msg [200];
  
  uVar4 = CONCAT71(in_register_00000031,type) & 0xffffffff;
  i = CONCAT71(in_register_00000031,type) & 0xffffffff;
  aux::peer_connection::peer_log
            (&this->m_pc->super_peer_connection,outgoing_message,"UT_METADATA",
             "type: %d (%s) piece: %d",uVar4,
             _ZZN10libtorrent12_GLOBAL__N_123ut_metadata_peer_plugin21write_metadata_packetENS0_5msg_tEiE5names_rel
             + *(int *)(
                       _ZZN10libtorrent12_GLOBAL__N_123ut_metadata_peer_plugin21write_metadata_packetENS0_5msg_tEiE5names_rel
                       + i * 4),piece);
  if (this->m_message_index != 0) {
    entry::entry(&e);
    key._M_str = "msg_type";
    key._M_len = 8;
    peVar3 = entry::operator[](&e,key);
    entry::operator=(peVar3,i);
    key_00._M_str = "piece";
    key_00._M_len = 5;
    peVar3 = entry::operator[](&e,key_00);
    entry::operator=(peVar3,(long)piece);
    if (0 < (((this->m_torrent->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_files).m_piece_length) {
      sVar6 = ut_metadata_plugin::metadata(this->m_tp);
      key_01._M_str = "total_size";
      key_01._M_len = 10;
      peVar3 = entry::operator[](&e,key_01);
      entry::operator=(peVar3,sVar6.m_len);
    }
    if ((char)uVar4 == '\x01') {
      sVar6 = ut_metadata_plugin::metadata(this->m_tp);
      pcVar5 = sVar6.m_ptr + piece * 0x4000;
      size = (int)sVar6.m_len + piece * -0x4000;
      if (0x3fff < size) {
        size = 0x4000;
      }
    }
    else {
      pcVar5 = (char *)0x0;
      size = 0;
    }
    header = msg;
    iVar2 = bencode<char*>(msg + 6,&e);
    aux::write_impl<unsigned_int,int,char*>(size + iVar2 + 2,&header);
    *header = '\x14';
    pcVar1 = header + 1;
    header = header + 1;
    *pcVar1 = (char)this->m_message_index;
    header = header + 1;
    sVar6.m_len = (long)(iVar2 + 6);
    sVar6.m_ptr = msg;
    aux::peer_connection::send_buffer(&this->m_pc->super_peer_connection,sVar6);
    if (size != 0) {
      holder.m_len = (long)size;
      holder.m_ptr = pcVar5;
      aux::bt_peer_connection::append_const_send_buffer<libtorrent::span<char>>
                (this->m_pc,holder,size);
    }
    counters::inc_stats_counter((this->m_pc->super_peer_connection).m_counters,0x67,1);
    counters::inc_stats_counter((this->m_pc->super_peer_connection).m_counters,0x66,1);
    entry::~entry(&e);
  }
  return;
}

Assistant:

void write_metadata_packet(msg_t const type, int const piece)
		{
			TORRENT_ASSERT(!m_pc.associated_torrent().expired());

#ifndef TORRENT_DISABLE_LOGGING
			static char const* names[] = {"request", "data", "dont-have"};
			char const* n = "";
			if (type >= msg_t::request && type <= msg_t::dont_have) n = names[static_cast<int>(type)];
			m_pc.peer_log(peer_log_alert::outgoing_message, "UT_METADATA"
				, "type: %d (%s) piece: %d", static_cast<int>(type), n, piece);
#endif

			// abort if the peer doesn't support the metadata extension
			if (m_message_index == 0) return;

			entry e;
			e["msg_type"] = static_cast<int>(type);
			e["piece"] = piece;

			char const* metadata = nullptr;
			int metadata_piece_size = 0;

			if (m_torrent.valid_metadata())
				e["total_size"] = m_tp.metadata().size();

			if (type == msg_t::piece)
			{
				TORRENT_ASSERT(piece >= 0 && piece < (m_tp.metadata().size() + 16 * 1024 - 1) / (16 * 1024));
				TORRENT_ASSERT(m_pc.associated_torrent().lock()->valid_metadata());
				TORRENT_ASSERT(m_torrent.valid_metadata());

				int const offset = piece * 16 * 1024;
				metadata = m_tp.metadata().data() + offset;
				metadata_piece_size = std::min(
					int(m_tp.metadata().size()) - offset, 16 * 1024);
				TORRENT_ASSERT(metadata_piece_size > 0);
				TORRENT_ASSERT(offset >= 0);
				TORRENT_ASSERT(offset + metadata_piece_size <= m_tp.metadata().size());
			}

			// TODO: 3 use the aux::write_* functions and the span here instead, it
			// will fit better with send_buffer()
			char msg[200];
			char* header = msg;
			char* p = &msg[6];
			int const len = bencode(p, e);
			int const total_size = 2 + len + metadata_piece_size;
			namespace io = aux;
			io::write_uint32(total_size, header);
			io::write_uint8(aux::bt_peer_connection::msg_extended, header);
			io::write_uint8(m_message_index, header);

			m_pc.send_buffer({msg, len + 6});
			// TODO: we really need to increment the refcounter on the torrent
			// while this buffer is still in the peer's send buffer
			if (metadata_piece_size)
			{
				m_pc.append_const_send_buffer(
					span<char>(const_cast<char*>(metadata), metadata_piece_size), metadata_piece_size);
			}

			m_pc.stats_counters().inc_stats_counter(counters::num_outgoing_extended);
			m_pc.stats_counters().inc_stats_counter(counters::num_outgoing_metadata);
		}